

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O3

void __thiscall
NativeEntryPointData::SetTJNativeAddress
          (NativeEntryPointData *this,JavascriptMethod nativeAddress,void *validationCookie)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->nativeAddress != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x61,"(this->nativeAddress == nullptr)","this->nativeAddress == nullptr");
    if (!bVar2) goto LAB_00608b6c;
    *puVar3 = 0;
  }
  if ((this->validationCookie).ptr != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x62,"(this->validationCookie == nullptr)",
                       "this->validationCookie == nullptr");
    if (!bVar2) {
LAB_00608b6c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->nativeAddress = (Type)nativeAddress;
  Memory::Recycler::WBSetBit((char *)&this->validationCookie);
  (this->validationCookie).ptr = validationCookie;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->validationCookie);
  return;
}

Assistant:

void
NativeEntryPointData::SetTJNativeAddress(Js::JavascriptMethod nativeAddress, void * validationCookie)
{
    Assert(this->nativeAddress == nullptr);
    Assert(this->validationCookie == nullptr);
    this->nativeAddress = nativeAddress;
    this->validationCookie = validationCookie;
}